

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O3

void __thiscall ktx::CommandInfo::executeInfo(CommandInfo *this)

{
  Reporter *report;
  OutputFormat OVar1;
  char *pcVar2;
  size_type sVar3;
  bool minified;
  ktx_error_code_e kVar4;
  size_type __rlen;
  InputStream inputStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  char *local_3d8;
  undefined1 local_3d0 [952];
  
  report = &(this->super_Command).super_Reporter;
  InputStream::InputStream
            ((InputStream *)local_3d0,&(this->options).super_OptionsSingleIn.inputFilepath,report);
  OVar1 = (this->options).super_OptionsFormat.format;
  if (OVar1 == json_mini) {
    minified = true;
  }
  else {
    if (OVar1 != json) {
      if (OVar1 != text) {
        __assert_fail("false && \"Internal error\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp"
                      ,0x7e,"void ktx::CommandInfo::executeInfo()");
      }
      kVar4 = printInfoText(this,(istream *)local_3d0._32_8_);
      goto LAB_001a0834;
    }
    minified = false;
  }
  kVar4 = printInfoJSON(this,(istream *)local_3d0._32_8_,minified);
LAB_001a0834:
  if (kVar4 != KTX_SUCCESS) {
    pcVar2 = (this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
    sVar3 = (this->options).super_OptionsSingleIn.inputFilepath._M_string_length;
    if ((sVar3 == 1) && (*pcVar2 == '-')) {
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      local_3f8.field_2._M_allocated_capacity._0_4_ = 0x69647473;
      local_3f8.field_2._M_allocated_capacity._4_2_ = 0x6e;
      local_3f8._M_string_length = 5;
    }
    else {
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,pcVar2,pcVar2 + sVar3);
    }
    local_3d8 = (char *)ktxErrorString(kVar4);
    Reporter::fatal<char_const(&)[37],std::__cxx11::string,char_const*>
              (report,INVALID_FILE,(char (*) [37])"Failed to process KTX2 file \"{}\": {}",
               &local_3f8,&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      CONCAT26(local_3f8.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_3f8.field_2._M_allocated_capacity._4_2_,
                                        local_3f8.field_2._M_allocated_capacity._0_4_)) + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_3d0 + 0x230));
  std::ios_base::~ios_base((ios_base *)(local_3d0 + 0x2b0));
  std::ifstream::~ifstream(local_3d0 + 0x28);
  if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  return;
}

Assistant:

void CommandInfo::executeInfo() {
    InputStream inputStream(options.inputFilepath, *this);

    KTX_error_code result;

    switch (options.format) {
    case OutputFormat::text:
        result = printInfoText(inputStream);
        break;
    case OutputFormat::json:
        result = printInfoJSON(inputStream, false);
        break;
    case OutputFormat::json_mini:
        result = printInfoJSON(inputStream, true);
        break;
    default:
        assert(false && "Internal error");
        return;
    }

    if (result != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to process KTX2 file \"{}\": {}", fmtInFile(options.inputFilepath), ktxErrorString(result));
}